

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  ostream *poVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  string filename;
  ifstream in;
  char *local_278;
  long local_270;
  char local_268 [16];
  string local_258;
  allocator local_238 [520];
  
  if (argc == 2) {
    std::__cxx11::string::string((string *)&local_278,argv[1],local_238);
    std::ifstream::ifstream(local_238);
    std::ifstream::open((char *)local_238,(_Ios_Openmode)local_278);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Can\'t open file: ",0x11);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_278,local_270);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      iVar7 = 1;
      std::ostream::flush();
    }
    else {
      readUINT32((ifstream *)local_238);
      readUINT32((ifstream *)local_238);
      readUINT32((ifstream *)local_238);
      readUINT32((ifstream *)local_238);
      readUINT32((ifstream *)local_238);
      readUINT32((ifstream *)local_238);
      readUINT32((ifstream *)local_238);
      readUINT32((ifstream *)local_238);
      uVar2 = readUINT32((ifstream *)local_238);
      readUINT32((ifstream *)local_238);
      uVar3 = readUINT32((ifstream *)local_238);
      uVar6 = uVar3 >> 1 & 1;
      uVar8 = uVar6 ^ 1;
      if ((uVar3 & 4) == 0) {
        uVar8 = 2 - uVar6;
      }
      iVar7 = uVar8 + ((uVar3 & 8) == 0);
      readUINT32((ifstream *)local_238);
      uVar3 = readUINT32((ifstream *)local_238);
      readUINT32((ifstream *)local_238);
      readUINT32((ifstream *)local_238);
      iVar10 = 0x2c;
      do {
        readUINT32((ifstream *)local_238);
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
      if (uVar3 != 0) {
        do {
          readUINT32((ifstream *)local_238);
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      if (uVar2 != 0) {
        do {
          readUINT32((ifstream *)local_238);
          uVar2 = uVar2 - 1;
        } while (uVar2 != 0);
      }
      if (iVar7 != 0) {
        iVar10 = iVar7 * 10000;
        do {
          readUINT32((ifstream *)local_238);
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      iVar10 = 0;
      do {
        uVar2 = readUINT32((ifstream *)local_238);
        if (uVar2 != 0) {
          uVar8 = (int)(short)((short)uVar2 + 0xf) & 0xfffffff0;
          if ((int)uVar8 < 1) {
            uVar3 = 0;
          }
          else {
            uVar6 = 0;
            uVar9 = 1;
            uVar3 = 0;
            do {
              uVar4 = readUINT32((ifstream *)local_238);
              readUINT32((ifstream *)local_238);
              if (uVar4 >> 0x18 == 1) {
                readUINT32((ifstream *)local_238);
LAB_00102813:
                readUINT32((ifstream *)local_238);
              }
              else if (uVar4 >> 0x18 == 2) goto LAB_00102813;
              readUINT32((ifstream *)local_238);
              readUINT32((ifstream *)local_238);
              readUINT32((ifstream *)local_238);
              readUINT32((ifstream *)local_238);
              readUINT32((ifstream *)local_238);
              readUINT32((ifstream *)local_238);
              readUINT32((ifstream *)local_238);
              readUINT32((ifstream *)local_238);
              readUINT32((ifstream *)local_238);
              readUINT32((ifstream *)local_238);
              readUINT32((ifstream *)local_238);
              readUINT32((ifstream *)local_238);
              readUINT32((ifstream *)local_238);
              readUINT32((ifstream *)local_238);
              if ((~uVar6 & 0xf) == 0) {
                uVar4 = readUINT32((ifstream *)local_238);
                readUINT32((ifstream *)local_238);
                uVar3 = uVar3 + uVar4;
              }
              uVar6 = uVar9 & 0xffff;
              uVar9 = uVar9 + 1;
            } while (uVar6 < uVar8);
          }
          if (uVar3 != uVar2) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Check error!",0xc);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
            std::ostream::put(-0x58);
            iVar7 = 1;
            std::ostream::flush();
            goto LAB_00102a07;
          }
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 != 5);
      readUINT32((ifstream *)local_238);
      if (iVar7 != 0) {
        iVar10 = 0;
        do {
          for (uVar2 = readUINT32((ifstream *)local_238); uVar2 != 0; uVar2 = uVar2 - 1) {
            readObject((ifstream *)local_238);
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 != iVar7);
      }
      iVar7 = 0;
      std::ifstream::close();
    }
LAB_00102a07:
    std::ifstream::~ifstream(local_238);
    if (local_278 != local_268) {
      operator_delete(local_278);
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_258,*argv,local_238);
    usage(&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p);
    }
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        usage(argv[0]);
        return 1;
    }

    std::string filename = argv[1];
    std::ifstream in;

    in.open(filename.c_str(), std::ios_base::binary | std::ios_base::in);
    if (!in.is_open())
    {
        std::cout << "Can't open file: " << filename << std::endl;
        return 1;
    }

    // 4 - version
    readUINT32(in);
    // 16 - name
    readUINT32(in);
    readUINT32(in);
    readUINT32(in);
    readUINT32(in);
    // 4 - default position
    readUINT32(in);
    // 4 - default elevation
    readUINT32(in);
    // 4 - default orientation
    readUINT32(in);
    // 4 - local vars
    uint32_t localVars = readUINT32(in);
    // 4 - SID
    readUINT32(in);
    // 4 - flags
    uint32_t flags = readUINT32(in);
    // 4 - elevations
    uint32_t elevations = 0;
    if ((flags & 2) == 0) elevations++;
    if ((flags & 4) == 0) elevations++;
    if ((flags & 8) == 0) elevations++;

    // 4 - unknown
    readUINT32(in);
    // 4 - global vars
    uint32_t globalVars = readUINT32(in);
    // 4 - map id
    readUINT32(in);
    // 4 - time
    readUINT32(in);
    // 4*44 - unknown
    for (unsigned i = 0; i != 44; ++i) readUINT32(in);
    // 4 * NUM-GLOBAL-VARS
    for (unsigned i = 0; i != globalVars; ++i) readUINT32(in);
    // 4 * NUM-LOCAL-VARS
    for (unsigned i = 0; i != localVars; ++i) readUINT32(in);
    // 100*100 * 2 * 2 * elevations  - tiles
    for (unsigned i = 0; i != 100*100*elevations; ++i) readUINT32(in);

    // SCRIPTS SECTION
    for (unsigned int i = 0; i < 5; i++)
    {
        uint32_t count = readUINT32(in);
        if (count > 0)
        {
            short loop = count;
            if (count%16 > 0 ) loop += 16 - count%16;

            unsigned int check = 0;
            for (unsigned short j = 0; j < loop; j++)
            {
                {
                    uint32_t PID = readUINT32(in);

                    readUINT32(in); // unknown1

                    switch ((PID & 0xFF000000) >> 24)
                    {
                        case 1:
                            readUINT32(in); //unknown 2
                            readUINT32(in); //unknown 3
                            break;
                        case 2:
                            readUINT32(in); //unknown 2
                            break;
                        default:
                            break;
                    }
                    readUINT32(in); //unknown 4
                    readUINT32(in); // scriptId
                    readUINT32(in); //unknown 5
                    readUINT32(in); //unknown 6
                    readUINT32(in); //unknown 7
                    readUINT32(in); //unknown 8
                    readUINT32(in); //unknown 9
                    readUINT32(in); //unknown 10
                    readUINT32(in); //unknown 11
                    readUINT32(in); //unknown 12
                    readUINT32(in); //unknown 13
                    readUINT32(in); //unknown 14
                    readUINT32(in); //unknown 15
                    readUINT32(in); //unknown 16

                    if (j < count)
                    {
                        //std::cout << "Map script: 0x" << std::hex << script->PID() << std::endl;
                    }

                }
                if ((j % 16) == 15)
                {
                    uint32_t v = readUINT32(in);
                    check += v;

                    readUINT32(in); // skip 4
                }
            }
            if (check != count)
            {
                std::cout << "Check error!" << std::endl;
                return 1;
            }
        }
    }

    // OBJECTS section
    uint32_t objectsTotal = readUINT32(in);

    //std::cout << "Objects: " << objectsTotal << std::endl;

    for (unsigned int i = 0; i != elevations; ++i)
        {
            uint32_t objectsOnElevation = readUINT32(in);
            for (unsigned int j = 0; j != objectsOnElevation; ++j)
            {
                readObject(in);
            }
        }


    in.close();
    return 0;
}